

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

size_t kwssys::SystemTools::CountChar(char *str,char c)

{
  size_t count;
  char c_local;
  char *str_local;
  
  count = 0;
  str_local = str;
  if (str != (char *)0x0) {
    for (; *str_local != '\0'; str_local = str_local + 1) {
      if (*str_local == c) {
        count = count + 1;
      }
    }
  }
  return count;
}

Assistant:

size_t SystemTools::CountChar(const char* str, char c)
{
  size_t count = 0;

  if (str) {
    while (*str) {
      if (*str == c) {
        ++count;
      }
      ++str;
    }
  }
  return count;
}